

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_deconstruction.h
# Opt level: O0

QuaternionData
ximu::PacketDeconstruction::
deconstructQuaternionData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           begin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 end)

{
  uchar uVar1;
  reference puVar2;
  float w;
  float x;
  float y;
  float z;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  end_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  begin_local;
  
  end_local = begin;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,1);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,2);
  w = FixedFloat::toFloat(uVar1,*puVar2,ALGORITHM_KI);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,3);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,4);
  x = FixedFloat::toFloat(uVar1,*puVar2,ALGORITHM_KI);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,5);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,6);
  y = FixedFloat::toFloat(uVar1,*puVar2,ALGORITHM_KI);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,7);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,8);
  z = FixedFloat::toFloat(uVar1,*puVar2,ALGORITHM_KI);
  Quaternion<float>::Quaternion((Quaternion<float> *)&begin_local,w,x,y,z);
  return _begin_local;
}

Assistant:

static QuaternionData deconstructQuaternionData(InputIterator begin, InputIterator end) {
    return
    QuaternionData (
      FixedFloat::toFloat(begin[1], begin[2], Qvals::QUATERNION),
      FixedFloat::toFloat(begin[3], begin[4], Qvals::QUATERNION),
      FixedFloat::toFloat(begin[5], begin[6], Qvals::QUATERNION),
      FixedFloat::toFloat(begin[7], begin[8], Qvals::QUATERNION));
  }